

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int.hpp
# Opt level: O0

int msgpack::v1::type::detail::convert_integer_sign<int,_true>::convert(object *o)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  type_error *this;
  int *in_RDI;
  type_error *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*in_RDI == 2) {
    uVar1 = *(ulong *)(in_RDI + 2);
    iVar3 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar3 < uVar1) {
      pvVar4 = (void *)__cxa_allocate_exception(8);
      memset(pvVar4,0,8);
      type_error::type_error(in_stack_ffffffffffffffd0);
      __cxa_throw(pvVar4,&type_error::typeinfo,type_error::~type_error);
    }
    local_4 = (int)*(undefined8 *)(in_RDI + 2);
  }
  else {
    if (*in_RDI != 3) {
      pvVar4 = (void *)__cxa_allocate_exception(8);
      memset(pvVar4,0,8);
      type_error::type_error(in_stack_ffffffffffffffd0);
      __cxa_throw(pvVar4,&type_error::typeinfo,type_error::~type_error);
    }
    lVar2 = *(long *)(in_RDI + 2);
    iVar3 = std::numeric_limits<int>::min();
    if (lVar2 < iVar3) {
      this = (type_error *)__cxa_allocate_exception(8);
      memset(this,0,8);
      type_error::type_error(this);
      __cxa_throw(this,&type_error::typeinfo,type_error::~type_error);
    }
    local_4 = (int)*(undefined8 *)(in_RDI + 2);
  }
  return local_4;
}

Assistant:

static T convert(msgpack::object const& o) {
        if(o.type == msgpack::type::POSITIVE_INTEGER) {
            if(o.via.u64 > static_cast<uint64_t>(std::numeric_limits<T>::max()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.u64);
        } else if(o.type == msgpack::type::NEGATIVE_INTEGER) {
            if(o.via.i64 < static_cast<int64_t>(std::numeric_limits<T>::min()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.i64);
        }
        throw msgpack::type_error();
    }